

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_func_call_arguments.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::FixFuncCallArgumentsPass::ReplaceAccessChainFuncCallArguments
          (FixFuncCallArgumentsPass *this,Instruction *func_call_inst,Instruction *operand_inst)

{
  Analysis preserved_analyses;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  IRContext *pIVar4;
  BasicBlock *this_00;
  DefUseManager *pDVar5;
  Instruction *pIVar6;
  TypeManager *this_01;
  Instruction *this_02;
  Instruction *this_03;
  Instruction *load;
  uint32_t operand_id;
  Instruction *var;
  uint32_t varType;
  Instruction *op_type;
  Instruction *op_ptr_type;
  undefined1 local_60 [16];
  Instruction *variable_insertion_point;
  Function *func;
  Instruction *next_insert_point;
  InstructionBuilder builder;
  Instruction *operand_inst_local;
  Instruction *func_call_inst_local;
  FixFuncCallArgumentsPass *this_local;
  
  builder._24_8_ = operand_inst;
  pIVar4 = Pass::context(&this->super_Pass);
  preserved_analyses = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)&next_insert_point,pIVar4,func_call_inst,preserved_analyses);
  func = (Function *)
         utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                   (&func_call_inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
  pIVar4 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_instr_block(pIVar4,func_call_inst);
  variable_insertion_point = (Instruction *)BasicBlock::GetParent(this_00);
  _op_ptr_type = opt::Function::begin((Function *)variable_insertion_point);
  UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
            ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&op_ptr_type);
  BasicBlock::begin((BasicBlock *)local_60);
  local_60._8_8_ =
       utils::IntrusiveList<spvtools::opt::Instruction>::
       iterator_template<spvtools::opt::Instruction>::operator*
                 ((iterator_template<spvtools::opt::Instruction> *)local_60);
  pDVar5 = Pass::get_def_use_mgr(&this->super_Pass);
  uVar1 = opt::Instruction::type_id((Instruction *)builder._24_8_);
  pIVar6 = analysis::DefUseManager::GetDef(pDVar5,uVar1);
  pDVar5 = Pass::get_def_use_mgr(&this->super_Pass);
  uVar1 = opt::Instruction::GetSingleWordInOperand(pIVar6,1);
  pIVar6 = analysis::DefUseManager::GetDef(pDVar5,uVar1);
  pIVar4 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_type_mgr(pIVar4);
  uVar1 = opt::Instruction::result_id(pIVar6);
  uVar1 = analysis::TypeManager::FindPointerToType(this_01,uVar1,Function);
  InstructionBuilder::SetInsertPoint
            ((InstructionBuilder *)&next_insert_point,(Instruction *)local_60._8_8_);
  this_02 = InstructionBuilder::AddVariable((InstructionBuilder *)&next_insert_point,uVar1,7);
  InstructionBuilder::SetInsertPoint((InstructionBuilder *)&next_insert_point,func_call_inst);
  uVar1 = opt::Instruction::result_id((Instruction *)builder._24_8_);
  uVar2 = opt::Instruction::result_id(pIVar6);
  this_03 = InstructionBuilder::AddLoad((InstructionBuilder *)&next_insert_point,uVar2,uVar1,0);
  uVar2 = opt::Instruction::result_id(this_02);
  uVar3 = opt::Instruction::result_id(this_03);
  InstructionBuilder::AddStore((InstructionBuilder *)&next_insert_point,uVar2,uVar3);
  InstructionBuilder::SetInsertPoint((InstructionBuilder *)&next_insert_point,(Instruction *)func);
  uVar2 = opt::Instruction::result_id(pIVar6);
  uVar3 = opt::Instruction::result_id(this_02);
  pIVar6 = InstructionBuilder::AddLoad((InstructionBuilder *)&next_insert_point,uVar2,uVar3,0);
  uVar2 = opt::Instruction::result_id(pIVar6);
  InstructionBuilder::AddStore((InstructionBuilder *)&next_insert_point,uVar1,uVar2);
  uVar1 = opt::Instruction::result_id(this_02);
  return uVar1;
}

Assistant:

uint32_t FixFuncCallArgumentsPass::ReplaceAccessChainFuncCallArguments(
    Instruction* func_call_inst, Instruction* operand_inst) {
  InstructionBuilder builder(
      context(), func_call_inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  Instruction* next_insert_point = func_call_inst->NextNode();
  // Get Variable insertion point
  Function* func = context()->get_instr_block(func_call_inst)->GetParent();
  Instruction* variable_insertion_point = &*(func->begin()->begin());
  Instruction* op_ptr_type = get_def_use_mgr()->GetDef(operand_inst->type_id());
  Instruction* op_type =
      get_def_use_mgr()->GetDef(op_ptr_type->GetSingleWordInOperand(1));
  uint32_t varType = context()->get_type_mgr()->FindPointerToType(
      op_type->result_id(), spv::StorageClass::Function);
  // Create new variable
  builder.SetInsertPoint(variable_insertion_point);
  Instruction* var =
      builder.AddVariable(varType, uint32_t(spv::StorageClass::Function));
  // Load access chain to the new variable before function call
  builder.SetInsertPoint(func_call_inst);

  uint32_t operand_id = operand_inst->result_id();
  Instruction* load = builder.AddLoad(op_type->result_id(), operand_id);
  builder.AddStore(var->result_id(), load->result_id());
  // Load return value to the acesschain after function call
  builder.SetInsertPoint(next_insert_point);
  load = builder.AddLoad(op_type->result_id(), var->result_id());
  builder.AddStore(operand_id, load->result_id());

  return var->result_id();
}